

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_free(ptls_t *tls)

{
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var1;
  void *pvVar2;
  ptls_iovec_t pVar3;
  ptls_iovec_t pVar4;
  ptls_t *tls_local;
  
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  ptls_buffer_dispose(&(tls->recvbuf).mess);
  if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
    key_schedule_free(tls->key_schedule);
  }
  if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
    ptls_aead_free((tls->traffic_protection).dec.aead);
  }
  if ((tls->traffic_protection).enc.aead != (ptls_aead_context_t *)0x0) {
    ptls_aead_free((tls->traffic_protection).enc.aead);
  }
  free(tls->server_name);
  if ((tls->field_7).client.certificate_verify.cb !=
      (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
    p_Var1 = (tls->field_7).client.certificate_verify.cb;
    pvVar2 = (tls->field_7).client.certificate_verify.verify_ctx;
    pVar3 = ptls_iovec_init((void *)0x0,0);
    pVar4 = ptls_iovec_init((void *)0x0,0);
    (*p_Var1)(pvVar2,pVar3,pVar4);
  }
  if ((tls->field_7).server.early_data != (st_ptls_early_data_receiver_t *)0x0) {
    (*ptls_clear_memory)((tls->field_7).server.early_data,0x40);
    free((tls->field_7).server.early_data);
  }
  (*ptls_clear_memory)(tls,0x130);
  free(tls);
  return;
}

Assistant:

void ptls_free(ptls_t *tls)
{
    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_buffer_dispose(&tls->recvbuf.mess);
    if (tls->key_schedule != NULL)
        key_schedule_free(tls->key_schedule);
    if (tls->traffic_protection.dec.aead != NULL)
        ptls_aead_free(tls->traffic_protection.dec.aead);
    if (tls->traffic_protection.enc.aead != NULL)
        ptls_aead_free(tls->traffic_protection.enc.aead);
    free(tls->server_name);
    if (tls->client.certificate_verify.cb != NULL)
        tls->client.certificate_verify.cb(tls->client.certificate_verify.verify_ctx, ptls_iovec_init(NULL, 0),
                                          ptls_iovec_init(NULL, 0));
    if (tls->server.early_data != NULL) {
        ptls_clear_memory(tls->server.early_data, sizeof(*tls->server.early_data));
        free(tls->server.early_data);
    }
    ptls_clear_memory(tls, sizeof(*tls));
    free(tls);
}